

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameTableTest(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3 *db;
  u64 uVar1;
  sqlite3_xauth p_Var2;
  Schema *pSVar3;
  Mem *pMem;
  int iVar4;
  int iVar5;
  char *zDb;
  char *pcVar6;
  i64 iVar7;
  Schema **ppSVar8;
  uint uVar9;
  Parse sParse;
  Parse local_208;
  NameContext local_68;
  
  db = context->pOut->db;
  zDb = (char *)sqlite3ValueText(*argv,'\x01');
  pcVar6 = (char *)sqlite3ValueText(argv[1],'\x01');
  iVar7 = sqlite3VdbeIntValue(argv[4]);
  uVar1 = db->flags;
  p_Var2 = db->xAuth;
  db->xAuth = (sqlite3_xauth)0x0;
  if (pcVar6 == (char *)0x0 || zDb == (char *)0x0) goto LAB_001bf676;
  iVar4 = renameParseSql(&local_208,zDb,1,db,pcVar6,(int)iVar7);
  if (iVar4 == 0) {
    uVar9 = (uint)uVar1;
    if ((local_208.pNewTable == (Table *)0x0 || (uVar9 >> 0x1a & 1) != 0) ||
       ((local_208.pNewTable)->pSelect == (Select *)0x0)) {
      if (local_208.pNewTrigger != (Trigger *)0x0) {
        if ((uVar9 >> 0x1a & 1) == 0) {
          pcVar6 = (char *)0x0;
          if ((int)iVar7 == 0) {
            pcVar6 = zDb;
          }
          iVar4 = renameResolveTrigger(&local_208,pcVar6);
          if (iVar4 != 0) goto LAB_001bf64a;
        }
        if ((local_208.pNewTrigger)->pTabSchema == (Schema *)0x0) {
          iVar4 = -1000000;
        }
        else {
          iVar4 = -1;
          ppSVar8 = &db->aDb->pSchema;
          do {
            iVar4 = iVar4 + 1;
            pSVar3 = *ppSVar8;
            ppSVar8 = ppSVar8 + 4;
          } while (pSVar3 != (local_208.pNewTrigger)->pTabSchema);
        }
        iVar5 = sqlite3FindDbName(db,zDb);
        if (iVar4 == iVar5) {
          pMem = context->pOut;
          if ((pMem->flags & 0x2400) == 0) {
            (pMem->u).r = 4.94065645841247e-324;
            pMem->flags = 4;
          }
          else {
            vdbeReleaseAndSetInt64(pMem,1);
          }
        }
      }
    }
    else {
      local_68.ncFlags = 0;
      local_68._44_4_ = 0;
      local_68.pWinSelect = (Select *)0x0;
      local_68.pNext = (NameContext *)0x0;
      local_68.nRef = 0;
      local_68.nErr = 0;
      local_68.pSrcList = (SrcList *)0x0;
      local_68.uNC.pEList = (ExprList *)0x0;
      local_68.pParse = &local_208;
      sqlite3SelectPrep(&local_208,(local_208.pNewTable)->pSelect,&local_68);
      if ((local_208.nErr != 0) && (local_208.rc != 0)) goto LAB_001bf64a;
    }
  }
  else {
LAB_001bf64a:
    renameColumnParseError(context,1,argv[2],argv[3],&local_208);
  }
  renameParseCleanup(&local_208);
LAB_001bf676:
  db->xAuth = p_Var2;
  return;
}

Assistant:

static void renameTableTest(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char const *zDb = (const char*)sqlite3_value_text(argv[0]);
  char const *zInput = (const char*)sqlite3_value_text(argv[1]);
  int bTemp = sqlite3_value_int(argv[4]);
  int isLegacy = (db->flags & SQLITE_LegacyAlter);

#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
  db->xAuth = 0;
#endif

  UNUSED_PARAMETER(NotUsed);
  if( zDb && zInput ){
    int rc;
    Parse sParse;
    rc = renameParseSql(&sParse, zDb, 1, db, zInput, bTemp);
    if( rc==SQLITE_OK ){
      if( isLegacy==0 && sParse.pNewTable && sParse.pNewTable->pSelect ){
        NameContext sNC;
        memset(&sNC, 0, sizeof(sNC));
        sNC.pParse = &sParse;
        sqlite3SelectPrep(&sParse, sParse.pNewTable->pSelect, &sNC);
        if( sParse.nErr ) rc = sParse.rc;
      }

      else if( sParse.pNewTrigger ){
        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse, bTemp ? 0 : zDb);
        }
        if( rc==SQLITE_OK ){
          int i1 = sqlite3SchemaToIndex(db, sParse.pNewTrigger->pTabSchema);
          int i2 = sqlite3FindDbName(db, zDb);
          if( i1==i2 ) sqlite3_result_int(context, 1);
        }
      }
    }

    if( rc!=SQLITE_OK ){
      renameColumnParseError(context, 1, argv[2], argv[3], &sParse);
    }
    renameParseCleanup(&sParse);
  }

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
}